

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void ptls_aead__build_iv(ptls_aead_context_t *ctx,uint8_t *iv,uint64_t seq)

{
  uint8_t uVar1;
  long lVar2;
  long lVar3;
  uint8_t *puVar4;
  
  puVar4 = ctx->static_iv;
  for (lVar2 = ctx->algo->iv_size - 8; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *puVar4;
    puVar4 = puVar4 + 1;
    *iv = uVar1;
    iv = iv + 1;
  }
  lVar3 = 0x38;
  lVar2 = 0;
  do {
    iv[lVar2] = (byte)(seq >> ((byte)lVar3 & 0x3f)) ^ puVar4[lVar2];
    lVar3 = lVar3 + -8;
    lVar2 = lVar2 + 1;
  } while (lVar3 != -8);
  return;
}

Assistant:

void ptls_aead__build_iv(ptls_aead_context_t *ctx, uint8_t *iv, uint64_t seq)
{
    size_t iv_size = ctx->algo->iv_size, i;
    const uint8_t *s = ctx->static_iv;
    uint8_t *d = iv;

    /* build iv */
    for (i = iv_size - 8; i != 0; --i)
        *d++ = *s++;
    i = 64;
    do {
        i -= 8;
        *d++ = *s++ ^ (uint8_t)(seq >> i);
    } while (i != 0);
}